

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9PrintTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  uint iPo;
  int iVar7;
  word Truth;
  
  iPo = 0;
  Extra_UtilGetoptReset();
  uVar3 = 0xffffffff;
  bVar2 = false;
  do {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"ORvh"), iVar7 = globalUtilOptind, iVar4 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar4 == -1) {
      pGVar1 = pAbc->pGia;
      if (pGVar1 == (Gia_Man_t *)0x0) {
        pcVar6 = "Abc_CommandAbc9PrintTruth(): There is no AIG.\n";
      }
      else if (pGVar1->vCis->nSize - pGVar1->nRegs < 7) {
        uVar5 = pGVar1->vCos->nSize;
        if ((int)(uVar3 + iPo) <= (int)(uVar5 - pGVar1->nRegs)) {
          if (uVar3 != 0xffffffff) {
            uVar5 = uVar3;
          }
          iVar7 = uVar5 + iPo;
          for (; (int)iPo < iVar7; iPo = iPo + 1) {
            Truth = Gia_LutComputeTruth6Simple(pAbc->pGia,iPo);
            printf("Output %8d : ",(ulong)iPo);
            Extra_PrintHex(_stdout,(uint *)&Truth,pAbc->pGia->vCis->nSize);
            putchar(10);
          }
          return 0;
        }
        pcVar6 = "Abc_CommandAbc9PrintTruth(): Range of outputs to extract is incorrect.\n";
      }
      else {
        pcVar6 = "The number of inputs of the AIG exceeds 6.\n";
      }
      iVar7 = -1;
      goto LAB_00246d47;
    }
    if (iVar4 == 0x52) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_00246cca;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      uVar3 = uVar5;
    }
    else {
      if (iVar4 != 0x4f) goto LAB_00246cd4;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-O\" should be followed by an integer.\n";
LAB_00246cca:
        Abc_Print(-1,pcVar6);
        goto LAB_00246cd4;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      iPo = uVar5;
    }
    globalUtilOptind = iVar7 + 1;
    if ((int)uVar5 < 0) {
LAB_00246cd4:
      iVar7 = -2;
      Abc_Print(-2,"usage: &print_truth [-OR num] [-vh]\n");
      Abc_Print(-2,"\t         prints truth tables of outputs in hex notation\n");
      Abc_Print(-2,"\t-O num : the index of first PO to print [default = %d]\n",(ulong)iPo);
      Abc_Print(-2,"\t-R num : (optional) the number of outputs to extract [default = all]\n");
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      pcVar6 = "\t-h     : print the command usage\n";
LAB_00246d47:
      Abc_Print(iVar7,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9PrintTruth( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern word Gia_LutComputeTruth6Simple( Gia_Man_t * p, int iPo );
    int i, c, iOutNum = 0, nOutRange = -1, fVerbose = 0; word Truth;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutRange < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9PrintTruth(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManPiNum(pAbc->pGia) > 6 )
    {
        Abc_Print( -1, "The number of inputs of the AIG exceeds 6.\n" );
        return 1;
    }
    if ( iOutNum < 0 || iOutNum + nOutRange > Gia_ManPoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9PrintTruth(): Range of outputs to extract is incorrect.\n" );
        return 1;
    }
    if ( nOutRange == -1 )
        nOutRange = Gia_ManCoNum(pAbc->pGia);
    for ( i = iOutNum; i < iOutNum + nOutRange; i++ )
    {
        Truth = Gia_LutComputeTruth6Simple( pAbc->pGia, i );
        printf( "Output %8d : ", i );
        Extra_PrintHex( stdout, (unsigned *)&Truth, Gia_ManCiNum(pAbc->pGia) );
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &print_truth [-OR num] [-vh]\n" );
    Abc_Print( -2, "\t         prints truth tables of outputs in hex notation\n" );
    Abc_Print( -2, "\t-O num : the index of first PO to print [default = %d]\n", iOutNum );
    Abc_Print( -2, "\t-R num : (optional) the number of outputs to extract [default = all]\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}